

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_componentNotEqualByNumberOfComponents_Test::TestBody
          (Equality_componentNotEqualByNumberOfComponents_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_178 [2];
  AssertHelper local_158 [8];
  Message local_150 [8];
  shared_ptr<libcellml::Entity> local_148;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_100 [8];
  Message local_f8 [8];
  shared_ptr<libcellml::Entity> local_f0;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_;
  string local_c0 [32];
  undefined1 local_a0 [8];
  ComponentPtr cChild1;
  string local_88 [32];
  undefined1 local_68 [8];
  ComponentPtr c2;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ComponentPtr c1;
  Equality_componentNotEqualByNumberOfComponents_Test *this_local;
  
  c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"c",&local_41);
  libcellml::Component::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"c",
             (allocator<char> *)
             ((long)&cChild1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&cChild1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"child1",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Component::create((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Component,void>
            (&local_f0,(shared_ptr<libcellml::Component> *)local_68);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_d9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar2) {
    testing::Message::Message(local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_d8,"c1->equals(c2)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x2ee,pcVar4);
    testing::internal::AssertHelper::operator=(local_100,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Component,void>
            (&local_148,(shared_ptr<libcellml::Component> *)local_20);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_131 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_148);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_178,local_130,"c2->equals(c1)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x2ef,pcVar4);
    testing::internal::AssertHelper::operator=(local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    std::__cxx11::string::~string((string *)local_178);
    testing::Message::~Message(local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_a0);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_68);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_20);
  return;
}

Assistant:

TEST(Equality, componentNotEqualByNumberOfComponents)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::ComponentPtr cChild1 = libcellml::Component::create("child1");

    c1->addComponent(cChild1);

    EXPECT_FALSE(c1->equals(c2));
    EXPECT_FALSE(c2->equals(c1));
}